

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.c
# Opt level: O2

int menu_screen(tgestate_t *state)

{
  byte bVar1;
  zxspectrum_t *pzVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint16_t uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  undefined6 extraout_var;
  ulong uVar11;
  undefined6 extraout_var_00;
  uint8_t *puVar12;
  int iVar13;
  char cVar14;
  char cVar15;
  long lVar16;
  byte *pcharacter;
  int iVar17;
  ushort *puVar18;
  char *pcharacter_00;
  uint8_t speaker1;
  uint8_t speaker0;
  uint local_5c;
  long local_58;
  ushort *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  keydefs_t *local_38;
  
  (*state->speccy->stamp)(state->speccy);
  bVar4 = (*state->speccy->in)(state->speccy,0xf7fe);
  if ((bVar4 & 0xf) == 0xf) {
    bVar4 = (*state->speccy->in)(state->speccy,0xeffe);
    cVar14 = -(bVar4 & 1);
LAB_0010ad74:
    if (cVar14 == '\0') {
      if (state->chosen_input_device != inputdevice_KEYBOARD) {
        return 2;
      }
      local_48 = (state->speccy->screen).pixels;
      local_58 = 0x47;
      local_38 = &state->keydefs;
      local_40 = &(state->keydefs).defs[0].mask;
LAB_0010af88:
      pzVar2 = state->speccy;
      iVar13 = state->rows;
      lVar16 = 0;
      do {
        memset((pzVar2->screen).pixels + game_window_start_offsets[lVar16],0,
               (long)state->columns - 1);
        lVar16 = lVar16 + 1;
      } while ((char)((char)iVar13 * '\b' + -8) != (char)lVar16);
      invalidate_bitmap(state,(pzVar2->screen).pixels + local_58,state->columns << 3,
                        state->rows * 8 + -8);
      set_game_window_attributes(state,'\a');
      cVar14 = '\x06';
      puVar18 = &choose_keys_choose_key_prompts;
      do {
        puVar12 = (state->speccy->screen).pixels + *puVar18;
        cVar15 = (char)puVar18[1];
        pcharacter_00 = *(char **)(puVar18 + 4);
        do {
          puVar12 = plot_glyph(state,pcharacter_00,puVar12);
          pcharacter_00 = pcharacter_00 + 1;
          cVar15 = cVar15 + -1;
        } while (cVar15 != '\0');
        puVar18 = puVar18 + 8;
        cVar14 = cVar14 + -1;
      } while (cVar14 != '\0');
      local_38->defs[4].port = '\0';
      local_38->defs[4].mask = '\0';
      local_38->defs[0].port = '\0';
      local_38->defs[0].mask = '\0';
      local_38->defs[1].port = '\0';
      local_38->defs[1].mask = '\0';
      local_38->defs[2].port = '\0';
      local_38->defs[2].mask = '\0';
      local_38->defs[3].port = '\0';
      local_38->defs[3].mask = '\0';
      cVar14 = '\x05';
      local_50 = &choose_keys_key_name_screen_offsets;
LAB_0010b040:
      local_5c = CONCAT31(local_5c._1_3_,cVar14);
      uVar8 = *local_50;
      local_50 = local_50 + 1;
      bVar4 = 0xff;
LAB_0010b054:
      do {
        iVar13 = menudelay(state,70000);
        if (iVar13 != 0) {
          return -1;
        }
        bVar5 = 0xff;
        lVar16 = 0;
        while (lVar16 != 8) {
          bVar5 = bVar5 + 1;
          bVar1 = choose_keys_keyboard_port_hi_bytes[lVar16 + 1];
          lVar16 = lVar16 + 1;
          bVar6 = (*state->speccy->in)(state->speccy,(ushort)bVar1 << 8 | 0xfe);
          uVar11 = 0x20;
          while ((uVar11 & 1) == 0) {
            uVar11 = uVar11 >> 1;
            if ((byte)((byte)uVar11 & ~bVar6) != 0) {
              puVar12 = local_40;
              if (bVar4 == 0) goto LAB_0010b0bd;
              goto LAB_0010b054;
            }
          }
        }
        bVar4 = 0;
      } while( true );
    }
    if (cVar14 == -1) goto LAB_0010adca;
  }
  else {
    bVar4 = bVar4 & 0xf ^ 0xf;
    cVar14 = '\x01';
    do {
      if ((bVar4 & 1) != 0) goto LAB_0010ad74;
      bVar4 = bVar4 >> 1;
      cVar14 = cVar14 + '\x01';
    } while (cVar14 != '\x05');
    cVar14 = '\x04';
  }
  set_menu_item_attributes(state,state->chosen_input_device,'\a');
  state->chosen_input_device = (uint)(byte)(cVar14 - 1);
  set_menu_item_attributes(state,(uint)(byte)(cVar14 - 1),'F');
LAB_0010adca:
  wave_morale_flag(state);
  uVar9 = *(int *)&state->music_channel0_index + 1;
  do {
    state->music_channel0_index = (uint16_t)uVar9;
    uVar10 = uVar9 & 0xffff;
    uVar9 = 0;
  } while ("\x13"[uVar10] == 0xff);
  uVar7 = frequency_for_semitone("\x13"[uVar10],&speaker0);
  local_5c = (uint)CONCAT62(extraout_var,uVar7);
  uVar8 = state->music_channel1_index + 1;
  do {
    state->music_channel1_index = uVar8;
    uVar11 = (ulong)uVar8;
    uVar8 = 0;
  } while ("\n"[uVar11] == 0xff);
  uVar7 = frequency_for_semitone("\n"[uVar11],&speaker1);
  uVar9 = (uint)CONCAT62(extraout_var_00,uVar7);
  if (0xfeff < uVar7) {
    uVar9 = local_5c;
  }
  cVar14 = '\x18';
  bVar4 = 0;
  local_50 = (ushort *)CONCAT44(local_50._4_4_,uVar9);
  uVar11 = (ulong)uVar9;
  uVar9 = local_5c;
  do {
    local_58 = CONCAT71(local_58._1_7_,cVar14);
    cVar14 = -1;
    do {
      uVar9 = uVar9 & 0xffff;
      iVar13 = (uVar9 >> 8) + 0xff;
      if (((char)iVar13 == '\0') && (bVar5 = (char)uVar9 - 1, uVar9 = (uint)bVar5, bVar5 == 0)) {
        speaker0 = speaker0 ^ 0x10;
        bVar4 = speaker0 & 0x10;
        (*state->speccy->out)(state->speccy,0xfe,speaker0);
        iVar17 = 2;
        uVar9 = local_5c;
      }
      else {
        iVar17 = 3;
        uVar9 = uVar9 & 0xff | iVar13 * 0x100;
      }
      uVar11 = uVar11 & 0xffff;
      uVar10 = (uint)uVar11;
      iVar13 = (int)(uVar11 >> 8) + 0xff;
      if (((char)iVar13 == '\0') && (bVar5 = (char)uVar11 - 1, uVar10 = (uint)bVar5, bVar5 == 0)) {
        speaker1 = speaker1 ^ 0x10;
        bVar4 = speaker1 & 0x10;
        (*state->speccy->out)(state->speccy,0xfe,speaker1);
        iVar17 = iVar17 + -1;
        uVar11 = (ulong)local_50 & 0xffffffff;
      }
      else {
        uVar11 = (ulong)(uVar10 & 0xff | iVar13 * 0x100);
      }
      for (; 0 < iVar17; iVar17 = iVar17 + -1) {
        (*state->speccy->out)(state->speccy,0xfe,bVar4);
      }
      cVar14 = cVar14 + -1;
    } while (cVar14 != '\0');
    cVar14 = (char)local_58 + -1;
  } while (cVar14 != '\0');
  iVar13 = (*state->speccy->sleep)(state->speccy,0x4954d);
  return -(uint)(iVar13 != 0);
LAB_0010b0bd:
  if (((keydef_t *)(puVar12 + -1))->port != 0) {
    if ((((keydef_t *)(puVar12 + -1))->port == bVar1) &&
       (bVar4 = bVar1, (uint)uVar11 == (uint)*puVar12)) goto LAB_0010b054;
    puVar12 = puVar12 + 2;
    goto LAB_0010b0bd;
  }
  ((keydef_t *)(puVar12 + -1))->port = bVar1;
  *puVar12 = (byte)uVar11;
  pcharacter = &UNK_0010e80f + (ulong)bVar5 * 5;
  do {
    pcharacter = pcharacter + 1;
    uVar3 = uVar11 & 1;
    uVar11 = uVar11 >> 1;
  } while (uVar3 == 0);
  cVar14 = '\x01';
  if ((char)*pcharacter < '\0') {
    uVar9 = *pcharacter & 0x7f;
    pcharacter = &UNK_0010e7f1 + uVar9;
    cVar14 = (&choose_keys_special_key_names)[uVar9];
  }
  puVar12 = local_48 + uVar8;
  do {
    puVar12 = plot_glyph(state,(char *)pcharacter,puVar12);
    pcharacter = pcharacter + 1;
    cVar14 = cVar14 + -1;
  } while (cVar14 != '\0');
  cVar14 = (char)local_5c + -1;
  if (cVar14 != '\0') goto LAB_0010b040;
  iVar13 = menudelay(state,350000);
  if (iVar13 != 0) {
    return -1;
  }
  iVar13 = user_confirm(state);
  if (iVar13 == 0) {
    return 2;
  }
  goto LAB_0010af88;
}

Assistant:

int menu_screen(tgestate_t *state)
{
  int      menu_keys_state;
  uint16_t counter_0;       /* was BC */
  uint16_t counter_1;       /* was BC' */
  uint16_t frequency_0;     /* was DE */
  uint16_t frequency_1;     /* was DE' */
  uint8_t  datum;           /* was A */
  uint8_t  major_delay;     /* was A */
  uint8_t  minor_delay;     /* was H */
  uint16_t channel0_index;  /* was HL */
  uint16_t channel1_index;  /* was HL' */
  uint8_t  speaker0;        /* was L */
  uint8_t  speaker1;        /* was L' */
  uint8_t  B;               /* was B */
  uint8_t  C;               /* was C */
  uint8_t  Bdash;           /* was B' */
  uint8_t  Cdash;           /* was C' */
  uint8_t  bit = 0; // most recently emitted bit

  assert(state != NULL);

  state->speccy->stamp(state->speccy);

  /* Conv: Menu driving loop was removed and the routine changed to return
   * non-zero when the game should begin. */
  menu_keys_state = check_menu_keys(state);
  if (menu_keys_state < 0 || menu_keys_state >= 2)
    return menu_keys_state; /* Start the game, or terminate the game thread */

  wave_morale_flag(state);

  /* Play music */

  channel0_index = state->music_channel0_index + 1;
  for (;;)
  {
    state->music_channel0_index = channel0_index;
    datum = music_channel0_data[channel0_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel0_index = 0;
  }
  frequency_0 = counter_0 = frequency_for_semitone(datum, &speaker0);

  channel1_index = state->music_channel1_index + 1;
  for (;;)
  {
    state->music_channel1_index = channel1_index;
    datum = music_channel1_data[channel1_index];
    if (datum != 0xFF) /* end marker */
      break;
    channel1_index = 0;
  }
  frequency_1 = counter_1 = frequency_for_semitone(datum, &speaker1);

  /* When the second channel is silent use the first channel's frequency. */
  if ((counter_1 >> 8) == 0xFF) // (BCdash >> 8) was Bdash;
    frequency_1 = counter_1 = counter_0;

  major_delay = 24; /* overall tune speed (a delay: lower values are faster) */
  do
  {
    minor_delay = 255;
    do
    {
      int to_emit = 3; // Conv: Whatever we do always emit this many bits

      // B,C are a pair of counters? half pulse length?
      // B = lo, C = hi  (in this routine)

      B = counter_0 >> 8;
      C = counter_0 & 0xFF;
      if (--B == 0 && --C == 0)
      {
        speaker0 ^= port_MASK_EAR;
        bit = speaker0 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker0);
        to_emit--;
        counter_0 = frequency_0;
      }
      else
      {
        counter_0 = (B << 8) | C;
      }

      Bdash = counter_1 >> 8;
      Cdash = counter_1 & 0xFF;
      if (--Bdash == 0 && --Cdash == 0)
      {
        speaker1 ^= port_MASK_EAR;
        bit = speaker1 & port_MASK_EAR;
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speaker1);
        to_emit--;
        counter_1 = frequency_1;
      }
      else
      {
        counter_1 = (Bdash << 8) | Cdash;
      }

      /* Conv: We simulate the EAR port holding its level by adding extra
       * OUTs here. */
      // FIXME: The timing needs working out here: 3 OUTs per loop works,
      // but why?
      while (to_emit-- > 0)
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, bit);
    }
    while (--minor_delay);
  }
  while (--major_delay);

  /* Conv: Timing: Calibrated to original game. */
  if (state->speccy->sleep(state->speccy, 300365))
    return -1; /* Terminate the game thread */

  return 0; /* Don't start the game */
}